

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall cmCTest::ProcessSteps(cmCTest *this)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  cmCTestGenericHandler *pcVar4;
  unsigned_long uVar5;
  char *__rhs;
  ostream *poVar6;
  uint uVar7;
  byte bVar8;
  ulong dindex;
  bool bVar9;
  double dVar10;
  allocator local_201;
  Directory d;
  string fullname;
  string local_1c8;
  string notes_dir;
  
  bVar8 = 1;
  for (lVar3 = 0x148; ((bVar8 & 1) != 0 && (lVar3 != 0x408)); lVar3 = lVar3 + 0x40) {
    bVar8 = *(byte *)((long)&this->RepeatTests + lVar3) ^ 1;
  }
  bVar9 = false;
  uVar7 = 0;
  if (this->Parts[1].Enabled != false) {
    dVar10 = GetRemainingTimeAllowed(this);
    bVar9 = false;
    uVar7 = 0;
    if (0.0 < dVar10 + -120.0) {
      pcVar4 = GetHandler(this,"update");
      std::__cxx11::string::string((string *)&notes_dir,"SourceDirectory",(allocator *)&d);
      std::__cxx11::string::string((string *)&local_1c8,"SourceDirectory",&local_201);
      GetCTestConfiguration(&fullname,this,&local_1c8);
      cmCTestGenericHandler::SetPersistentOption(pcVar4,&notes_dir,fullname._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&fullname);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&notes_dir);
      uVar1 = (*pcVar4->_vptr_cmCTestGenericHandler[1])(pcVar4);
      uVar7 = uVar1 >> 0x1f;
      bVar9 = uVar1 != 0;
    }
  }
  if ((!bVar9) && (this->TestModel == 2)) {
    return 0;
  }
  if ((this->Parts[2].Enabled == true) &&
     (dVar10 = GetRemainingTimeAllowed(this), 0.0 < dVar10 + -120.0)) {
    pcVar4 = GetHandler(this,"configure");
    iVar2 = (*pcVar4->_vptr_cmCTestGenericHandler[1])(pcVar4);
    uVar7 = uVar7 + (iVar2 >> 0x1f) * -2;
  }
  if ((this->Parts[3].Enabled == true) &&
     (dVar10 = GetRemainingTimeAllowed(this), 0.0 < dVar10 + -120.0)) {
    UpdateCTestConfiguration(this);
    pcVar4 = GetHandler(this,"build");
    iVar2 = (*pcVar4->_vptr_cmCTestGenericHandler[1])(pcVar4);
    uVar7 = uVar7 + (iVar2 >> 0x1f) * -4;
  }
  if ((((this->Parts[4].Enabled | bVar8) & 1) != 0) &&
     (dVar10 = GetRemainingTimeAllowed(this), 0.0 < dVar10 + -120.0)) {
    UpdateCTestConfiguration(this);
    pcVar4 = GetHandler(this,"test");
    iVar2 = (*pcVar4->_vptr_cmCTestGenericHandler[1])(pcVar4);
    uVar7 = uVar7 + (iVar2 >> 0x1f) * -8;
  }
  if ((this->Parts[5].Enabled == true) &&
     (dVar10 = GetRemainingTimeAllowed(this), 0.0 < dVar10 + -120.0)) {
    UpdateCTestConfiguration(this);
    pcVar4 = GetHandler(this,"coverage");
    uVar1 = (*pcVar4->_vptr_cmCTestGenericHandler[1])(pcVar4);
    uVar7 = (uVar1 >> 0x1a & 0xffffffe0) + uVar7;
  }
  if ((this->Parts[6].Enabled == true) &&
     (dVar10 = GetRemainingTimeAllowed(this), 0.0 < dVar10 + -120.0)) {
    UpdateCTestConfiguration(this);
    pcVar4 = GetHandler(this,"memcheck");
    uVar1 = (*pcVar4->_vptr_cmCTestGenericHandler[1])(pcVar4);
    uVar7 = uVar1 >> 0x1b & 0xfffffff0 | uVar7;
  }
  if ((bVar8 & 1) == 0) {
    std::operator+(&notes_dir,&this->BinaryDir,"/Testing/Notes");
    bVar9 = cmsys::SystemTools::FileIsDirectory(&notes_dir);
    if (bVar9) {
      cmsys::Directory::Directory(&d);
      cmsys::Directory::Load(&d,&notes_dir);
      for (dindex = 0; uVar5 = cmsys::Directory::GetNumberOfFiles(&d), dindex < uVar5;
          dindex = dindex + 1) {
        __rhs = cmsys::Directory::GetFile(&d,dindex);
        std::operator+(&local_1c8,&notes_dir,"/");
        std::operator+(&fullname,&local_1c8,__rhs);
        std::__cxx11::string::~string((string *)&local_1c8);
        bVar9 = cmsys::SystemTools::FileExists(fullname._M_dataplus._M_p);
        if ((bVar9) && (bVar9 = cmsys::SystemTools::FileIsDirectory(&fullname), !bVar9)) {
          if ((this->NotesFiles)._M_string_length != 0) {
            std::__cxx11::string::append((char *)&this->NotesFiles);
          }
          std::__cxx11::string::append((string *)&this->NotesFiles);
          this->Parts[8].Enabled = true;
        }
        std::__cxx11::string::~string((string *)&fullname);
      }
      cmsys::Directory::~Directory(&d);
    }
    std::__cxx11::string::~string((string *)&notes_dir);
  }
  if ((this->Parts[8].Enabled == true) &&
     (UpdateCTestConfiguration(this), (this->NotesFiles)._M_string_length != 0)) {
    GenerateNotesFile(this,(this->NotesFiles)._M_dataplus._M_p);
  }
  if (this->Parts[7].Enabled == true) {
    UpdateCTestConfiguration(this);
    pcVar4 = GetHandler(this,"submit");
    iVar2 = (*pcVar4->_vptr_cmCTestGenericHandler[1])(pcVar4);
    if (iVar2 < 0) {
      uVar7 = uVar7 | 0x40;
      goto LAB_002ddb3d;
    }
  }
  if (uVar7 == 0) {
    return 0;
  }
LAB_002ddb3d:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&notes_dir);
  poVar6 = std::operator<<((ostream *)&notes_dir,"Errors while running CTest");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::stringbuf::str();
  Log(this,6,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x39d,fullname._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&fullname);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&notes_dir);
  return uVar7;
}

Assistant:

int cmCTest::ProcessSteps()
{
  int res = 0;
  bool notest = true;
  int update_count = 0;

  for (Part p = PartStart; notest && p != PartCount; p = Part(p + 1)) {
    notest = !this->Parts[p];
  }
  if (this->Parts[PartUpdate] && (this->GetRemainingTimeAllowed() - 120 > 0)) {
    cmCTestGenericHandler* uphandler = this->GetHandler("update");
    uphandler->SetPersistentOption(
      "SourceDirectory",
      this->GetCTestConfiguration("SourceDirectory").c_str());
    update_count = uphandler->ProcessHandler();
    if (update_count < 0) {
      res |= cmCTest::UPDATE_ERRORS;
    }
  }
  if (this->TestModel == cmCTest::CONTINUOUS && !update_count) {
    return 0;
  }
  if (this->Parts[PartConfigure] &&
      (this->GetRemainingTimeAllowed() - 120 > 0)) {
    if (this->GetHandler("configure")->ProcessHandler() < 0) {
      res |= cmCTest::CONFIGURE_ERRORS;
    }
  }
  if (this->Parts[PartBuild] && (this->GetRemainingTimeAllowed() - 120 > 0)) {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("build")->ProcessHandler() < 0) {
      res |= cmCTest::BUILD_ERRORS;
    }
  }
  if ((this->Parts[PartTest] || notest) &&
      (this->GetRemainingTimeAllowed() - 120 > 0)) {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("test")->ProcessHandler() < 0) {
      res |= cmCTest::TEST_ERRORS;
    }
  }
  if (this->Parts[PartCoverage] &&
      (this->GetRemainingTimeAllowed() - 120 > 0)) {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("coverage")->ProcessHandler() < 0) {
      res |= cmCTest::COVERAGE_ERRORS;
    }
  }
  if (this->Parts[PartMemCheck] &&
      (this->GetRemainingTimeAllowed() - 120 > 0)) {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("memcheck")->ProcessHandler() < 0) {
      res |= cmCTest::MEMORY_ERRORS;
    }
  }
  if (!notest) {
    std::string notes_dir = this->BinaryDir + "/Testing/Notes";
    if (cmSystemTools::FileIsDirectory(notes_dir)) {
      cmsys::Directory d;
      d.Load(notes_dir);
      unsigned long kk;
      for (kk = 0; kk < d.GetNumberOfFiles(); kk++) {
        const char* file = d.GetFile(kk);
        std::string fullname = notes_dir + "/" + file;
        if (cmSystemTools::FileExists(fullname.c_str()) &&
            !cmSystemTools::FileIsDirectory(fullname)) {
          if (!this->NotesFiles.empty()) {
            this->NotesFiles += ";";
          }
          this->NotesFiles += fullname;
          this->Parts[PartNotes].Enable();
        }
      }
    }
  }
  if (this->Parts[PartNotes]) {
    this->UpdateCTestConfiguration();
    if (!this->NotesFiles.empty()) {
      this->GenerateNotesFile(this->NotesFiles.c_str());
    }
  }
  if (this->Parts[PartSubmit]) {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("submit")->ProcessHandler() < 0) {
      res |= cmCTest::SUBMIT_ERRORS;
    }
  }
  if (res != 0) {
    cmCTestLog(this, ERROR_MESSAGE, "Errors while running CTest" << std::endl);
  }
  return res;
}